

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O0

void ma_wrench_tf_tgt_to_ref(ga_pose *x,ma_wrench *f,ma_wrench *r)

{
  ma_wrench *r_local;
  ma_wrench *f_local;
  ga_pose *x_local;
  
  if (x == (ga_pose *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x6a,
                  "void ma_wrench_tf_tgt_to_ref(const struct ga_pose *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  if (f == (ma_wrench *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x6b,
                  "void ma_wrench_tf_tgt_to_ref(const struct ga_pose *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  if (r == (ma_wrench *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x6c,
                  "void ma_wrench_tf_tgt_to_ref(const struct ga_pose *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  if (f != r) {
    if (f->point != f->frame->origin) {
      __assert_fail("f->point == f->frame->origin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                    ,0x6e,
                    "void ma_wrench_tf_tgt_to_ref(const struct ga_pose *, const struct ma_wrench *, struct ma_wrench *)"
                   );
    }
    if (f->frame == x->target_frame) {
      r->body = f->body;
      r->frame = x->reference_frame;
      r->point = r->frame->origin;
      return;
    }
    __assert_fail("f->frame == x->target_frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x6f,
                  "void ma_wrench_tf_tgt_to_ref(const struct ga_pose *, const struct ma_wrench *, struct ma_wrench *)"
                 );
  }
  __assert_fail("f != r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x6d,
                "void ma_wrench_tf_tgt_to_ref(const struct ga_pose *, const struct ma_wrench *, struct ma_wrench *)"
               );
}

Assistant:

void ma_wrench_tf_tgt_to_ref(
        const struct ga_pose *x,
        const struct ma_wrench *f,
        struct ma_wrench *r)
{
    assert(x);
    assert(f);
    assert(r);
    assert(f != r);
    assert(f->point == f->frame->origin);
    assert(f->frame == x->target_frame);

    r->body = f->body;
    r->frame = x->reference_frame;
    r->point = r->frame->origin;
}